

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocaleData::applyIntegerFormatting
          (QString *__return_storage_ptr__,QLocaleData *this,QString *numStr,bool negative,
          int precision,int base,int width,uint flags)

{
  qsizetype qVar1;
  Data *pDVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  QChar *pQVar6;
  char16_t *pcVar7;
  undefined7 extraout_var;
  int iVar8;
  QChar *pQVar9;
  QChar *pQVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  qsizetype i_2;
  undefined1 *puVar14;
  long in_FS_OFFSET;
  GroupSizes GVar15;
  QString local_c8;
  QStringBuilder<QString,_const_QStringView_&> local_a8;
  QString local_88;
  QStringView local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (base == 10) {
    localeString(&local_58,this,ZeroDigit,
                 (DataRange)((ulong)this->m_zero_size << 0x20 | (ulong)this->m_zero_idx));
  }
  else {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = L"0";
    local_58.d.size = 1;
  }
  qVar1 = local_58.d.size;
  pQVar9 = (QChar *)0x0;
  uVar5 = (ulong)(numStr->d).size / (ulong)local_58.d.size;
  local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = (QChar *)0x0;
  if (-1 < (char)flags) goto LAB_00318100;
  if (base == 2) {
    pcVar7 = L"0B";
    if ((flags >> 8 & 1) == 0) {
      pcVar7 = L"0b";
    }
    pQVar10 = (QChar *)0x0;
    do {
      if (((QChar *)pcVar7)[(long)pQVar10].ucs == L'\0') goto LAB_003180ef;
      pQVar10 = (QChar *)((long)&pQVar10->ucs + 1);
    } while (pQVar10 != (QChar *)0x3);
LAB_003180d3:
    pQVar10 = (QChar *)0x3;
LAB_003180ef:
    bVar3 = false;
    pQVar6 = (QChar *)pcVar7;
    pQVar9 = pQVar10;
  }
  else {
    bVar3 = true;
    if (base == 8) {
      bVar4 = QString::startsWith(numStr,&local_58,CaseSensitive);
      pQVar6 = (QChar *)CONCAT71(extraout_var,bVar4);
      pcVar7 = local_58.d.ptr;
      pQVar10 = (QChar *)local_58.d.size;
      if (!bVar4) goto LAB_003180ef;
    }
    else if (base == 0x10) {
      pcVar7 = L"0X";
      if ((flags >> 8 & 1) == 0) {
        pcVar7 = L"0x";
      }
      pQVar10 = (QChar *)0x0;
      do {
        if (((QChar *)pcVar7)[(long)pQVar10].ucs == L'\0') goto LAB_003180ef;
        pQVar10 = (QChar *)((long)&pQVar10->ucs + 1);
      } while (pQVar10 != (QChar *)0x3);
      goto LAB_003180d3;
    }
  }
  if (bVar3) {
    pQVar6 = (QChar *)0x0;
    pQVar9 = (QChar *)0x0;
  }
LAB_00318100:
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.m_size = (qsizetype)pQVar9;
  local_68.m_data = &pQVar6->ucs;
  signPrefix(&local_c8,this,negative,flags);
  local_a8.a.d.size = local_c8.d.size;
  local_a8.a.d.ptr = local_c8.d.ptr;
  local_a8.a.d.d = local_c8.d.d;
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char16_t *)0x0;
  local_c8.d.size = 0;
  local_a8.b = &local_68;
  QStringBuilder<QString,_const_QStringView_&>::convertTo<QString>(&local_88,&local_a8);
  if (&(local_a8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  puVar14 = (undefined1 *)(local_88.d.size + uVar5);
  if ((flags & 0x20) != 0 && base == 10) {
    GVar15 = groupSizes(this);
    local_a8.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    localeString(&local_a8.a,this,GroupSeparator,
                 (DataRange)((ulong)this->m_groupDelim_size << 0x20 | (ulong)this->m_groupDelim_idx)
                );
    lVar13 = uVar5 - (long)GVar15.least;
    if (GVar15.first <= lVar13) {
      pcVar7 = local_a8.a.d.ptr;
      if ((QChar *)local_a8.a.d.ptr == (QChar *)0x0) {
        pcVar7 = L"";
      }
      QString::insert(numStr,lVar13 * qVar1,(QChar *)pcVar7,local_a8.a.d.size);
      lVar11 = GVar15._0_8_ >> 0x20;
      while( true ) {
        puVar14 = puVar14 + 1;
        lVar12 = lVar13 - lVar11;
        if (lVar12 == 0 || lVar13 < lVar11) break;
        pcVar7 = local_a8.a.d.ptr;
        if ((QChar *)local_a8.a.d.ptr == (QChar *)0x0) {
          pcVar7 = L"";
        }
        QString::insert(numStr,lVar12 * qVar1,(QChar *)pcVar7,local_a8.a.d.size);
        lVar13 = lVar12;
      }
    }
    if (&(local_a8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  iVar8 = 1;
  if (precision != -1) {
    iVar8 = precision;
  }
  lVar13 = (numStr->d).size;
  lVar11 = (long)iVar8;
  lVar12 = lVar11 - lVar13;
  if (lVar12 != 0 && lVar13 <= lVar11) {
    puVar14 = puVar14 + (lVar11 - lVar13);
    do {
      pcVar7 = local_58.d.ptr;
      if ((QChar *)local_58.d.ptr == (QChar *)0x0) {
        pcVar7 = L"";
      }
      QString::insert(numStr,0,(QChar *)pcVar7,local_58.d.size);
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  if ((flags & 6) == 2 && precision == -1) {
    for (; (long)puVar14 < (long)width; puVar14 = puVar14 + 1) {
      pcVar7 = local_58.d.ptr;
      if ((QChar *)local_58.d.ptr == (QChar *)0x0) {
        pcVar7 = L"";
      }
      QString::insert(numStr,0,(QChar *)pcVar7,local_58.d.size);
    }
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if ((flags & 0x40) == 0) {
    pDVar2 = (numStr->d).d;
    pcVar7 = (numStr->d).ptr;
    (numStr->d).d = (Data *)0x0;
    (numStr->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = pcVar7;
    qVar1 = (numStr->d).size;
    (numStr->d).size = 0;
    (__return_storage_ptr__->d).size = qVar1;
  }
  else {
    QString::toUpper_helper(__return_storage_ptr__,numStr);
  }
  if ((undefined1 *)local_88.d.size != (undefined1 *)0x0) {
    pcVar7 = local_88.d.ptr;
    if ((QChar *)local_88.d.ptr == (QChar *)0x0) {
      pcVar7 = L"";
    }
    QString::insert(__return_storage_ptr__,0,(QChar *)pcVar7,local_88.d.size);
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocaleData::applyIntegerFormatting(QString &&numStr, bool negative, int precision,
                                            int base, int width, unsigned flags) const
{
    const QString zero = base == 10 ? zeroDigit() : QStringLiteral("0");
    const auto digitWidth = zero.size();
    const auto digitCount = numStr.size() / digitWidth;

    const auto basePrefix = [&] () -> QStringView {
        if (flags & ShowBase) {
            const bool upper = flags & UppercaseBase;
            if (base == 16)
                return upper ? u"0X" : u"0x";
            if (base == 2)
                return upper ? u"0B" : u"0b";
            if (base == 8 && !numStr.startsWith(zero))
                return zero;
        }
        return {};
    }();

    const QString prefix = signPrefix(negative, flags) + basePrefix;
    // Count how much of width we've used up.  Each digit counts as one
    qsizetype usedWidth = digitCount + prefix.size();

    if (base == 10 && flags & GroupDigits) {
        const QLocaleData::GroupSizes grouping = groupSizes();
        const QString group = groupSeparator();
        qsizetype i = digitCount - grouping.least;
        if (i >= grouping.first) {
            numStr.insert(i * digitWidth, group);
            ++usedWidth;
            while ((i -= grouping.higher) > 0) {
                numStr.insert(i * digitWidth, group);
                ++usedWidth;
            }
        }
        // TODO: should we group any zero-padding we add later ?
    }

    const bool noPrecision = precision == -1;
    if (noPrecision)
        precision = 1;

    for (qsizetype i = numStr.size(); i < precision; ++i) {
        numStr.prepend(zero);
        usedWidth++;
    }

    // LeftAdjusted overrides ZeroPadded; and sprintf() only pads when
    // precision is not specified in the format string.
    if (noPrecision && flags & ZeroPadded && !(flags & LeftAdjusted)) {
        for (qsizetype i = usedWidth; i < width; ++i)
            numStr.prepend(zero);
    }

    QString result(flags & CapitalEorX ? std::move(numStr).toUpper() : std::move(numStr));
    if (prefix.size())
        result.prepend(prefix);
    return result;
}